

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities
          (ConsumerEndpointImpl *this,QueryCapabilitiesCallback *callback)

{
  ObservableEvents_Type local_6c;
  undefined1 local_68 [24];
  iterator local_50;
  ObservableEvents_Type *local_48;
  bool local_40;
  byte local_18;
  
  protos::gen::TracingServiceCapabilities::TracingServiceCapabilities
            ((TracingServiceCapabilities *)local_68);
  local_68[8] = true;
  local_40 = true;
  local_18 = local_18 | 10;
  local_6c = ObservableEvents_Type_TYPE_DATA_SOURCES_INSTANCES;
  if (local_50._M_current == local_48) {
    ::std::
    vector<perfetto::protos::gen::ObservableEvents_Type,std::allocator<perfetto::protos::gen::ObservableEvents_Type>>
    ::_M_realloc_insert<perfetto::protos::gen::ObservableEvents_Type&>
              ((vector<perfetto::protos::gen::ObservableEvents_Type,std::allocator<perfetto::protos::gen::ObservableEvents_Type>>
                *)(local_68 + 0x10),local_50,&local_6c);
  }
  else {
    *local_50._M_current = ObservableEvents_Type_TYPE_DATA_SOURCES_INSTANCES;
    local_50._M_current = local_50._M_current + 1;
  }
  local_6c = ObservableEvents_Type_TYPE_ALL_DATA_SOURCES_STARTED;
  if (local_50._M_current == local_48) {
    ::std::
    vector<perfetto::protos::gen::ObservableEvents_Type,std::allocator<perfetto::protos::gen::ObservableEvents_Type>>
    ::_M_realloc_insert<perfetto::protos::gen::ObservableEvents_Type&>
              ((vector<perfetto::protos::gen::ObservableEvents_Type,std::allocator<perfetto::protos::gen::ObservableEvents_Type>>
                *)(local_68 + 0x10),local_50,&local_6c);
  }
  else {
    *local_50._M_current = ObservableEvents_Type_TYPE_ALL_DATA_SOURCES_STARTED;
    local_50._M_current = local_50._M_current + 1;
  }
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*callback->_M_invoker)((_Any_data *)callback,(TracingServiceCapabilities *)local_68);
    protos::gen::TracingServiceCapabilities::~TracingServiceCapabilities
              ((TracingServiceCapabilities *)local_68);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities(
    QueryCapabilitiesCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceCapabilities caps;
  caps.set_has_query_capabilities(true);
  caps.set_has_trace_config_output_path(true);
  caps.add_observable_events(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES);
  caps.add_observable_events(ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);
  static_assert(ObservableEvents::Type_MAX ==
                    ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED,
                "");
  callback(caps);
}